

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O1

void tlb_set_dirty_m68k(CPUState *cpu,target_ulong_conflict vaddr)

{
  void *pvVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  
  pvVar1 = cpu->env_ptr;
  uVar3 = vaddr & 0xfffff000;
  lVar4 = 0;
  do {
    lVar2 = *(long *)((long)pvVar1 + lVar4 + -0x28);
    uVar6 = (ulong)((*(uint *)((long)pvVar1 + lVar4 + -0x30) >> 6 & vaddr >> 0xc) << 6);
    if (*(int *)(lVar2 + 4 + uVar6) == uVar3 + 0x400) {
      *(uint *)(lVar2 + uVar6 + 4) = uVar3;
    }
    lVar4 = lVar4 + 0x10;
  } while (lVar4 == 0x10);
  lVar2 = (long)pvVar1 + -0x564;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      if (*(uint *)(lVar2 + lVar5) == (uVar3 | 0x400)) {
        *(uint *)(lVar2 + lVar5) = uVar3;
      }
      lVar5 = lVar5 + 0x40;
    } while (lVar5 != 0x200);
    lVar2 = lVar2 + 0x2b0;
    bVar7 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar7);
  return;
}

Assistant:

void tlb_set_dirty(CPUState *cpu, target_ulong vaddr)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    CPUArchState *env = cpu->env_ptr;
    int mmu_idx;

    // assert_cpu_is_self(cpu);

    vaddr &= TARGET_PAGE_MASK;
    for (mmu_idx = 0; mmu_idx < NB_MMU_MODES; mmu_idx++) {
        tlb_set_dirty1_locked(tlb_entry(env, mmu_idx, vaddr), vaddr);
    }

    for (mmu_idx = 0; mmu_idx < NB_MMU_MODES; mmu_idx++) {
        int k;
        for (k = 0; k < CPU_VTLB_SIZE; k++) {
            tlb_set_dirty1_locked(&env_tlb(env)->d[mmu_idx].vtable[k], vaddr);
        }
    }
}